

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

void free_FFSTypeHandle(FFSTypeHandle_conflict f)

{
  FFSTypeHandle_conflict *__ptr;
  long lVar1;
  
  if (f->conversion != (IOConversionPtr)0x0) {
    FFSfree_conversion(f->conversion);
  }
  __ptr = f->subformats;
  if (__ptr != (FFSTypeHandle_conflict *)0x0) {
    lVar1 = 0;
    do {
      if (*(FFSTypeHandle_conflict *)((long)__ptr + lVar1) == (FFSTypeHandle_conflict)0x0) break;
      free_FFSTypeHandle(*(FFSTypeHandle_conflict *)((long)__ptr + lVar1));
      *(undefined8 *)((long)f->subformats + lVar1) = 0;
      __ptr = f->subformats;
      lVar1 = lVar1 + 8;
    } while (__ptr != (FFSTypeHandle_conflict *)0x0);
  }
  free(__ptr);
  free(f->field_subformats);
  free(f);
  return;
}

Assistant:

extern
void
free_FFSTypeHandle(FFSTypeHandle f)
{
    int i = 0;
    if (f->conversion) FFSfree_conversion(f->conversion);
    while(f->subformats && f->subformats[i]) {
	free_FFSTypeHandle(f->subformats[i]);
	f->subformats[i] = NULL;
	i++;
    }
    free(f->subformats);
    free(f->field_subformats);
    free(f);
}